

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O1

double __thiscall
FSAOHDist_NECOF::GetOHProb_relT
          (FSAOHDist_NECOF *this,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohI)

{
  pointer puVar1;
  pointer puVar2;
  pointer pvVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  
  puVar1 = (agSc->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar13 = (long)(agSc->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar13 == 0) {
    dVar14 = 1.0;
  }
  else {
    puVar2 = (ohI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(ohI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    pvVar3 = (this->_m_oHistMarginals).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->_m_oHistMarginals).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    dVar14 = 1.0;
    uVar10 = 0;
    uVar12 = 1;
    do {
      uVar8 = uVar9;
      uVar11 = uVar10;
      if ((uVar9 <= uVar10) ||
         (uVar7 = (ulong)puVar1[uVar10], uVar8 = uVar6, uVar11 = uVar7,
         uVar6 < uVar7 || uVar6 - uVar7 == 0)) {
LAB_003fee76:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11,uVar8);
      }
      uVar11 = (ulong)puVar2[uVar10];
      lVar4 = *(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      uVar8 = (long)*(pointer *)
                     ((long)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar4 >> 3;
      if (uVar8 <= uVar11) goto LAB_003fee76;
      dVar14 = dVar14 * *(double *)(lVar4 + uVar11 * 8);
      bVar5 = uVar12 < (ulong)(lVar13 >> 2);
      uVar10 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  return dVar14;
}

Assistant:

double FSAOHDist_NECOF::GetOHProb_relT(
        const Scope& agSc, 
        const std::vector<Index>& ohI)
    const
{
    double p = 1.0;
    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI = agSc.at(i);
        Index ohI_agI = ohI.at(i);
        double p_this_agent = _m_oHistMarginals.at(agI).at(ohI_agI);
        p *= p_this_agent;
    }
    return p;
}